

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphericalHarmonic.cpp
# Opt level: O0

ComplexType __thiscall
OpenMD::SphericalHarmonic::getValueAt(SphericalHarmonic *this,RealType costheta,RealType phi)

{
  long in_RDI;
  RealType __r;
  double in_XMM1_Qa;
  complex<double> cVar1;
  ComplexType phase;
  RealType p;
  complex<double> *in_stack_ffffffffffffff78;
  complex<double> *__z;
  complex<double> local_60;
  RealType in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  SphericalHarmonic *in_stack_ffffffffffffffc0;
  
  __r = Ptilde(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
               (int)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  __z = (complex<double> *)0x0;
  std::complex<double>::complex
            ((complex<double> *)&stack0xffffffffffffffc0,0.0,
             (double)*(int *)(in_RDI + 0xc) * in_XMM1_Qa);
  std::exp<double>(__z);
  std::complex<double>::complex(&local_60,__r,(double)__z);
  cVar1 = std::operator*(in_stack_ffffffffffffff78,(complex<double> *)0x36e1eb);
  return (ComplexType)cVar1._M_value;
}

Assistant:

ComplexType SphericalHarmonic::getValueAt(RealType costheta, RealType phi) {
  RealType p;

  // associated Legendre polynomial
  p = Ptilde(L, M, costheta);
  ComplexType phase(0.0, (RealType)M * phi);

  return exp(phase) * (ComplexType)p;
}